

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  char cVar5;
  byte bVar6;
  xpath_value_type xVar7;
  undefined8 uVar8;
  byte *pbVar9;
  bool bVar10;
  undefined1 uVar11;
  bool bVar12;
  int *piVar13;
  xml_attribute xVar14;
  byte *pbVar15;
  char *pcVar16;
  long lVar17;
  int *dst;
  xpath_ast_node *pxVar18;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar19;
  char_t *pcVar20;
  byte bVar21;
  less_equal *in_R8;
  byte bVar22;
  xml_node_struct *pxVar23;
  xpath_memory_block *pxVar24;
  xpath_node *pxVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  double v;
  xpath_allocator_capture local_f8;
  undefined1 local_d4;
  undefined3 uStack_d3;
  xpath_node_set_raw local_d0;
  xpath_node_set_raw local_b0;
  double local_90;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_d4 = xpath_type_none;
  uStack_d3 = 0;
LAB_0010c5b8:
  cVar4 = this->_type;
  uVar11 = xpath_type_node_set;
  switch(cVar4) {
  case '\x01':
    bVar10 = eval_boolean(this->_left,c,stack);
    if (bVar10) goto switchD_0010c5ff_caseD_2f;
    break;
  case '\x02':
    bVar10 = eval_boolean(this->_left,c,stack);
    if (!bVar10) goto switchD_0010c5ff_caseD_30;
    break;
  case '\x03':
    goto switchD_0010c5d0_caseD_3;
  case '\x04':
    pxVar18 = this->_left;
    this = this->_right;
    cVar4 = pxVar18->_rettype;
    cVar5 = this->_rettype;
    if ((cVar4 == '\x01') || (cVar5 == '\x01')) {
      if (cVar5 == '\x01' && cVar4 == '\x01') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_node_set(&local_d0,pxVar18,c,stack,nodeset_eval_all);
        eval_node_set(&local_b0,this,c,stack,nodeset_eval_all);
        uVar11 = local_d0._begin != local_d0._end;
        if (!(bool)uVar11) goto LAB_0010cc63;
        uVar11 = true;
        pxVar24 = (xpath_memory_block *)local_b0._begin;
        pxVar25 = local_d0._begin;
        goto LAB_0010cf76;
      }
      pxVar19 = pxVar18;
      if (cVar4 == '\x01') {
        pxVar19 = this;
        cVar4 = cVar5;
        this = pxVar18;
      }
      if (cVar4 == '\x02') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        local_88 = eval_number(pxVar19,c,stack);
        eval_node_set(&local_d0,this,c,stack,nodeset_eval_all);
        uVar11 = local_d0._begin != local_d0._end;
        if (local_d0._begin == local_d0._end) goto LAB_0010cc63;
        uVar11 = true;
        pxVar25 = local_d0._begin;
        goto LAB_0010d23d;
      }
      if (cVar4 == '\x03') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_80,pxVar19,c,stack);
        eval_node_set(&local_d0,this,c,stack,nodeset_eval_all);
        uVar11 = local_d0._begin != local_d0._end;
        if (local_d0._begin == local_d0._end) goto LAB_0010cc63;
        uVar11 = true;
        pxVar25 = local_d0._begin;
        goto LAB_0010d16f;
      }
      if (cVar4 == '\x04') {
        bVar10 = eval_boolean(pxVar19,c,stack);
        bVar12 = eval_boolean(this,c,stack);
        uVar11 = bVar12 != bVar10;
        goto switchD_0010c5ff_caseD_2f;
      }
    }
    else {
      if (cVar4 == '\x04' || cVar5 == '\x04') {
        bVar10 = eval_boolean(pxVar18,c,stack);
        local_d4 = local_d4 ^ bVar10;
        goto LAB_0010c5b8;
      }
      if (cVar4 == '\x02' || cVar5 == '\x02') {
        local_90 = eval_number(pxVar18,c,stack);
        auVar28._0_8_ = eval_number(this,c,stack);
        auVar28._8_56_ = extraout_var_00;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_90;
        uVar8 = vcmpsd_avx512f(auVar28._0_16_,auVar3,4);
        uVar11 = (char)uVar8 & xpath_type_node_set;
        goto switchD_0010c5ff_caseD_2f;
      }
      if (cVar4 == '\x03' || cVar5 == '\x03') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_d0,pxVar18,c,stack);
        eval_string((xpath_string *)&local_b0,this,c,stack);
        bVar10 = strequal((char_t *)local_d0._0_8_,(char_t *)local_b0._0_8_);
        uVar11 = !bVar10;
        goto LAB_0010cc63;
      }
    }
    pcVar16 = 
    "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::not_equal_to]"
    ;
    goto LAB_0010d2f8;
  case '\x05':
    pxVar19 = this->_left;
    pxVar18 = this->_right;
    goto LAB_0010c7bd;
  case '\x06':
    pxVar18 = this->_left;
    pxVar19 = this->_right;
LAB_0010c7bd:
    uVar11 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                       (pxVar19,pxVar18,c,stack,(less *)in_R8);
    goto switchD_0010c5ff_caseD_2f;
  case '\a':
    pxVar19 = this->_left;
    pxVar18 = this->_right;
    goto LAB_0010c7a6;
  case '\b':
    pxVar18 = this->_left;
    pxVar19 = this->_right;
LAB_0010c7a6:
    uVar11 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                       (pxVar19,pxVar18,c,stack,in_R8);
    goto switchD_0010c5ff_caseD_2f;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0010c5d0_caseD_9;
  case '\x14':
    xVar7 = ((this->_data).variable)->_type;
    if (xVar7 != (byte)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2898,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == 4) {
      if (xVar7 != xpath_type_boolean) goto switchD_0010c5ff_caseD_30;
      uVar11 = (undefined1)(this->_data).variable[1]._type;
      goto switchD_0010c5ff_caseD_2f;
    }
switchD_0010c5d0_caseD_9:
    cVar4 = this->_rettype;
    if (cVar4 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_d0,this,c,stack,nodeset_eval_any);
      bVar10 = local_d0._begin == local_d0._end;
    }
    else {
      if (cVar4 != '\x03') {
        if (cVar4 != '\x02') {
          __assert_fail("false && \"Wrong expression for return type boolean\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x28b5,
                        "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                       );
        }
        auVar26._0_8_ = eval_number(this,c,stack);
        if ((auVar26._0_8_ != 0.0) || (NAN(auVar26._0_8_))) {
          auVar26._8_8_ = 0;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = auVar26._0_8_;
          uVar8 = vcmpsd_avx512f(auVar26,auVar1,0);
          uVar11 = (char)uVar8 & xpath_type_node_set;
          goto switchD_0010c5ff_caseD_2f;
        }
        goto switchD_0010c5ff_caseD_30;
      }
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_d0,this,c,stack);
      bVar10 = *(byte *)local_d0._0_8_ == 0;
    }
LAB_0010c993:
    uVar11 = !bVar10;
    goto LAB_0010cc63;
  default:
    switch(cVar4) {
    case '\"':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      eval_string((xpath_string *)&local_b0,this->_right,c,stack);
      uVar11 = *(byte *)(xpath_memory_block **)local_b0._0_8_ == 0;
      if ((bool)uVar11) goto LAB_0010cc63;
      if (*(byte *)local_d0._0_8_ != *(byte *)(xpath_memory_block **)local_b0._0_8_)
      goto LAB_0010cc60;
      lVar17 = 1;
      goto LAB_0010c8fc;
    case '#':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      eval_string((xpath_string *)&local_b0,this->_right,c,stack);
      pcVar16 = strstr((char *)local_d0._0_8_,(char *)local_b0._0_8_);
      bVar10 = pcVar16 == (char *)0x0;
      goto LAB_0010c993;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_0010c5d0_caseD_9;
    case '-':
      goto switchD_0010c5ff_caseD_2d;
    case '.':
      bVar10 = eval_boolean(this->_left,c,stack);
      goto LAB_0010cb43;
    case '/':
      goto switchD_0010c5ff_caseD_2f;
    case '0':
      break;
    case '1':
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_d0,this->_left,c,stack);
        uVar11 = false;
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          pxVar23 = (c->n)._node._root;
        }
        else {
          pxVar23 = (xml_node_struct *)0x0;
        }
        local_b0._0_8_ = pxVar23;
        if (pxVar23 == (xml_node_struct *)0x0) goto LAB_0010cc63;
        goto LAB_0010cb75;
      }
      break;
    default:
      if (cVar4 != ';') goto switchD_0010c5d0_caseD_9;
      dst = (int *)(this->_right->_data).string;
      if (this->_right->_type != '\x12') {
        if (*dst == 3) {
          piVar13 = *(int **)(dst + 4);
        }
        else {
          piVar13 = (int *)0x0;
        }
        dst = (int *)0x119371;
        if (piVar13 != (int *)0x0) {
          dst = piVar13;
        }
      }
      uVar11 = xpath_type_none;
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        local_f8._target = (xpath_allocator *)(c->n)._node._root;
      }
      else {
        local_f8._target = (xpath_allocator *)0x0;
      }
      xVar14 = xml_node::attribute((xml_node *)&local_f8,(this->_left->_data).string);
      if (xVar14._attr == (xml_attribute_struct *)0x0) goto switchD_0010c5ff_caseD_2f;
      pcVar20 = (xVar14._attr)->value;
      if (pcVar20 == (char_t *)0x0) {
        pcVar20 = "";
      }
      bVar10 = strequal(pcVar20,(char_t *)dst);
      if (bVar10) {
        pcVar20 = "";
        if ((xVar14._attr)->name != (char_t *)0x0) {
          pcVar20 = (xVar14._attr)->name;
        }
        uVar11 = is_xpath_attribute(pcVar20);
        goto switchD_0010c5ff_caseD_2f;
      }
    }
switchD_0010c5ff_caseD_30:
    uVar11 = xpath_type_none;
    goto switchD_0010c5ff_caseD_2f;
  }
  this = this->_right;
  goto LAB_0010c5b8;
  while (pxVar23 = pxVar23->parent, local_b0._0_8_ = pxVar23, pxVar23 != (xml_node_struct *)0x0) {
LAB_0010cb75:
    local_b0._0_8_ = pxVar23;
    xVar14 = xml_node::attribute((xml_node *)&local_b0,(char_t *)"xml:lang");
    if (xVar14._attr != (xml_attribute_struct *)0x0) {
      pbVar15 = (xVar14._attr)->value;
      if (pbVar15 == (byte *)0x0) {
        pbVar15 = (byte *)0x119371;
      }
      bVar6 = *(byte *)local_d0._0_8_;
      bVar10 = bVar6 == 0;
      if (!bVar10) {
        bVar21 = bVar6 | 0x20;
        if (0x19 < bVar6 - 0x41) {
          bVar21 = bVar6;
        }
        bVar6 = *pbVar15;
        bVar22 = bVar6 | 0x20;
        if (0x19 < bVar6 - 0x41) {
          bVar22 = bVar6;
        }
        pbVar9 = (byte *)local_d0._0_8_;
        if (bVar21 == bVar22) {
          do {
            pbVar15 = pbVar15 + 1;
            bVar6 = pbVar9[1];
            bVar10 = bVar6 == 0;
            if (bVar10) goto LAB_0010cc33;
            bVar21 = bVar6 | 0x20;
            if (0x19 < bVar6 - 0x41) {
              bVar21 = bVar6;
            }
            bVar6 = *pbVar15;
            bVar22 = bVar6 | 0x20;
            if (0x19 < bVar6 - 0x41) {
              bVar22 = bVar6;
            }
            pbVar9 = pbVar9 + 1;
          } while (bVar21 == bVar22);
        }
        uVar11 = false;
      }
LAB_0010cc33:
      if (bVar10) {
        uVar11 = *pbVar15 == 0x2d || *pbVar15 == 0;
      }
    }
    if (xVar14._attr != (xml_attribute_struct *)0x0) goto LAB_0010cc63;
  }
  goto LAB_0010cc60;
switchD_0010c5ff_caseD_2d:
  this = this->_left;
  goto LAB_0010c5b8;
  while (pbVar15 = (byte *)(local_d0._0_8_ + lVar17), lVar17 = lVar17 + 1, *pbVar15 == bVar6) {
LAB_0010c8fc:
    bVar6 = *(byte *)((long)(xpath_memory_block **)local_b0._0_8_ + lVar17);
    uVar11 = bVar6 == 0;
    if ((bool)uVar11) goto LAB_0010cc63;
  }
LAB_0010cc60:
  uVar11 = false;
  goto LAB_0010cc63;
  while( true ) {
    pxVar25 = pxVar25 + 1;
    uVar11 = pxVar25 != local_d0._end;
    pxVar24 = (xpath_memory_block *)local_b0._begin;
    if (!(bool)uVar11) break;
LAB_0010cf76:
    if (pxVar24 != (xpath_memory_block *)local_b0._end) {
      local_80._target = stack->result;
      local_80._state._error = (local_80._target)->_error;
      local_80._state._root = (local_80._target)->_root;
      local_80._state._root_size = (local_80._target)->_root_size;
      string_value(&local_60,pxVar25,local_80._target);
      string_value(&local_48,(xpath_node *)pxVar24,stack->result);
      bVar10 = strequal(local_60._buffer,local_48._buffer);
      xpath_allocator_capture::~xpath_allocator_capture(&local_80);
      if (!bVar10) break;
      pxVar24 = (xpath_memory_block *)&pxVar24->field_2;
      goto LAB_0010cf76;
    }
  }
  goto LAB_0010cc63;
  while( true ) {
    pxVar25 = pxVar25 + 1;
    uVar11 = pxVar25 != local_d0._end;
    if (!(bool)uVar11) break;
LAB_0010d23d:
    local_b0._0_8_ = stack->result;
    local_b0._eos = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->value;
    local_b0._begin = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->header;
    local_b0._end = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->name;
    string_value((xpath_string *)&local_80,pxVar25,(xpath_allocator *)local_b0._0_8_);
    local_90 = convert_string_to_number((char_t *)local_80._target);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_b0);
    if ((local_88 != local_90) || (NAN(local_88) || NAN(local_90))) break;
  }
  goto LAB_0010cc63;
switchD_0010c5d0_caseD_3:
  pxVar18 = this->_left;
  pxVar19 = this->_right;
  cVar4 = pxVar18->_rettype;
  cVar5 = pxVar19->_rettype;
  if (cVar5 == '\x01' || cVar4 == '\x01') {
    if (cVar5 == '\x01' && cVar4 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_d0,pxVar18,c,stack,nodeset_eval_all);
      eval_node_set(&local_b0,pxVar19,c,stack,nodeset_eval_all);
      uVar11 = local_d0._begin != local_d0._end;
      if ((bool)uVar11) {
        uVar11 = true;
        pxVar24 = (xpath_memory_block *)local_b0._begin;
        pxVar25 = local_d0._begin;
        do {
          for (; pxVar24 != (xpath_memory_block *)local_b0._end;
              pxVar24 = (xpath_memory_block *)&pxVar24->field_2) {
            local_80._target = stack->result;
            local_80._state._error = (local_80._target)->_error;
            local_80._state._root = (local_80._target)->_root;
            local_80._state._root_size = (local_80._target)->_root_size;
            string_value(&local_60,pxVar25,local_80._target);
            string_value(&local_48,(xpath_node *)pxVar24,stack->result);
            bVar10 = strequal(local_60._buffer,local_48._buffer);
            xpath_allocator_capture::~xpath_allocator_capture(&local_80);
            if (bVar10) goto LAB_0010cc63;
          }
          pxVar25 = pxVar25 + 1;
          uVar11 = pxVar25 != local_d0._end;
          pxVar24 = (xpath_memory_block *)local_b0._begin;
        } while ((bool)uVar11);
      }
    }
    else {
      this_00 = pxVar18;
      if (cVar4 == '\x01') {
        this_00 = pxVar19;
        cVar4 = cVar5;
        pxVar19 = pxVar18;
      }
      if (cVar4 == '\x02') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        local_88 = eval_number(this_00,c,stack);
        eval_node_set(&local_d0,pxVar19,c,stack,nodeset_eval_all);
        uVar11 = local_d0._begin != local_d0._end;
        if ((bool)uVar11) {
          uVar11 = true;
          pxVar25 = local_d0._begin;
          do {
            local_b0._0_8_ = stack->result;
            local_b0._eos = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->value;
            local_b0._begin = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->header;
            local_b0._end = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->name;
            string_value((xpath_string *)&local_80,pxVar25,(xpath_allocator *)local_b0._0_8_);
            local_90 = convert_string_to_number((char_t *)local_80._target);
            xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_b0);
            if ((local_88 == local_90) && (!NAN(local_88) && !NAN(local_90))) break;
            pxVar25 = pxVar25 + 1;
            uVar11 = pxVar25 != local_d0._end;
          } while ((bool)uVar11);
        }
      }
      else {
        if (cVar4 != '\x03') {
          if (cVar4 != '\x04') goto LAB_0010d2e3;
          bVar12 = eval_boolean(this_00,c,stack);
          goto LAB_0010cb32;
        }
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_80,this_00,c,stack);
        eval_node_set(&local_d0,pxVar19,c,stack,nodeset_eval_all);
        uVar11 = local_d0._begin != local_d0._end;
        if ((bool)uVar11) {
          uVar11 = true;
          pxVar25 = local_d0._begin;
          do {
            local_b0._0_8_ = stack->result;
            local_b0._eos = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->value;
            local_b0._begin = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->header;
            local_b0._end = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->name;
            string_value(&local_60,pxVar25,(xpath_allocator *)local_b0._0_8_);
            bVar10 = strequal((char_t *)local_80._target,local_60._buffer);
            xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_b0);
            if (bVar10) break;
            pxVar25 = pxVar25 + 1;
            uVar11 = pxVar25 != local_d0._end;
          } while ((bool)uVar11);
        }
      }
    }
    goto LAB_0010cc63;
  }
  if (cVar5 == '\x04' || cVar4 == '\x04') {
    bVar12 = eval_boolean(pxVar18,c,stack);
LAB_0010cb32:
    bVar10 = eval_boolean(pxVar19,c,stack);
    bVar10 = (bool)(bVar10 ^ bVar12);
LAB_0010cb43:
    uVar11 = bVar10 ^ local_d4 ^ xpath_type_node_set;
    goto LAB_0010cce8;
  }
  if (cVar4 != '\x02' && cVar5 != '\x02') {
    if (cVar4 != '\x03' && cVar5 != '\x03') {
LAB_0010d2e3:
      pcVar16 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::equal_to]"
      ;
LAB_0010d2f8:
      __assert_fail("false && \"Wrong types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x258a,pcVar16);
    }
    local_f8._target = stack->result;
    local_f8._state._root = (local_f8._target)->_root;
    local_f8._state._root_size = (local_f8._target)->_root_size;
    local_f8._state._error = (local_f8._target)->_error;
    eval_string((xpath_string *)&local_d0,pxVar18,c,stack);
    eval_string((xpath_string *)&local_b0,pxVar19,c,stack);
    uVar11 = strequal((char_t *)local_d0._0_8_,(char_t *)local_b0._0_8_);
    goto LAB_0010cc63;
  }
  local_90 = eval_number(pxVar18,c,stack);
  auVar27._0_8_ = eval_number(pxVar19,c,stack);
  auVar27._8_56_ = extraout_var;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_90;
  uVar8 = vcmpsd_avx512f(auVar27._0_16_,auVar2,0);
  uVar11 = (char)uVar8 & xpath_type_node_set;
  goto switchD_0010c5ff_caseD_2f;
  while( true ) {
    pxVar25 = pxVar25 + 1;
    uVar11 = pxVar25 != local_d0._end;
    if (!(bool)uVar11) break;
LAB_0010d16f:
    local_b0._0_8_ = stack->result;
    local_b0._eos = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->value;
    local_b0._begin = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->header;
    local_b0._end = (xpath_node *)((xml_node_struct *)local_b0._0_8_)->name;
    string_value(&local_60,pxVar25,(xpath_allocator *)local_b0._0_8_);
    bVar10 = strequal((char_t *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_b0);
    if (!bVar10) break;
  }
LAB_0010cc63:
  xpath_allocator_capture::~xpath_allocator_capture(&local_f8);
switchD_0010c5ff_caseD_2f:
  uVar11 = uVar11 ^ local_d4;
LAB_0010cce8:
  return (bool)(uVar11 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_number:
					return convert_number_to_boolean(eval_number(c, stack));

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_string(c, stack).empty();
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_node_set(c, stack, nodeset_eval_any).empty();
				}

				default:
					assert(false && "Wrong expression for return type boolean"); // unreachable
					return false;
				}
			}
			}
		}